

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O3

int WebRtcIsac_EncodeStoredDataUb
              (ISACUBSaveEncDataStruct *ISACSavedEnc_obj,Bitstr *bitStream,int32_t jitterInfo,
              float scale,ISACBandwidth bandwidth)

{
  undefined1 auVar1 [16];
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  int iVar5;
  int iVar6;
  undefined1 auVar7 [12];
  undefined1 auVar8 [12];
  int16_t iVar9;
  int iVar10;
  long lVar11;
  uint16_t **cdf;
  int16_t *fi;
  int16_t *fr;
  bool bVar12;
  double dVar13;
  undefined1 auVar14 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar22 [16];
  double lpcGain [6];
  int16_t imagFFT [240];
  int16_t realFFT [240];
  double local_418 [6];
  int16_t local_3e8 [240];
  int16_t local_208 [244];
  undefined1 auVar15 [16];
  undefined1 auVar20 [16];
  undefined1 auVar16 [16];
  undefined1 auVar21 [16];
  
  bitStream->W_upper = 0xffffffff;
  bitStream->streamval = 0;
  bitStream->stream_index = 0;
  WebRtcIsac_EncodeJitterInfo(jitterInfo,bitStream);
  iVar9 = WebRtcIsac_EncodeBandwidth(bandwidth,bitStream);
  if (iVar9 < 0) {
    iVar10 = (int)iVar9;
  }
  else {
    bVar12 = bandwidth != isac12kHz;
    if (bVar12) {
      cdf = WebRtcIsac_kLpcShapeCdfMatUb16;
    }
    else {
      cdf = WebRtcIsac_kLpcShapeCdfMatUb12;
    }
    WebRtcIsac_EncHistMulti(bitStream,ISACSavedEnc_obj->indexLPCShape,cdf,(uint)bVar12 * 8 + 8);
    if ((scale <= 0.0) || (1.0 <= scale)) {
      WebRtcIsac_EncHistMulti(bitStream,ISACSavedEnc_obj->lpcGainIndex,WebRtcIsac_kLpcGainCdfMat,6);
      if (bandwidth == isac16kHz) {
        WebRtcIsac_EncHistMulti
                  (bitStream,ISACSavedEnc_obj->lpcGainIndex + 6,WebRtcIsac_kLpcGainCdfMat,6);
      }
      fr = ISACSavedEnc_obj->realFFT;
      fi = ISACSavedEnc_obj->imagFFT;
    }
    else {
      dVar13 = (double)scale;
      lVar11 = 0;
      do {
        dVar2 = (ISACSavedEnc_obj->lpcGain + lVar11)[1] * dVar13;
        auVar18._8_4_ = SUB84(dVar2,0);
        auVar18._0_8_ = ISACSavedEnc_obj->lpcGain[lVar11] * dVar13;
        auVar18._12_4_ = (int)((ulong)dVar2 >> 0x20);
        *(undefined1 (*) [16])(local_418 + lVar11) = auVar18;
        lVar11 = lVar11 + 2;
      } while (lVar11 != 6);
      WebRtcIsac_StoreLpcGainUb(local_418,bitStream);
      if (bandwidth == isac16kHz) {
        lVar11 = 0;
        do {
          dVar2 = (ISACSavedEnc_obj->lpcGain + lVar11 + 6)[1] * dVar13;
          auVar1._8_4_ = SUB84(dVar2,0);
          auVar1._0_8_ = ISACSavedEnc_obj->lpcGain[lVar11 + 6] * dVar13;
          auVar1._12_4_ = (int)((ulong)dVar2 >> 0x20);
          *(undefined1 (*) [16])(local_418 + lVar11) = auVar1;
          lVar11 = lVar11 + 2;
        } while (lVar11 != 6);
        WebRtcIsac_StoreLpcGainUb(local_418,bitStream);
      }
      lVar11 = 0;
      do {
        auVar18 = *(undefined1 (*) [16])(ISACSavedEnc_obj->realFFT + lVar11);
        auVar16._0_12_ = auVar18._0_12_;
        auVar16._12_2_ = auVar18._6_2_;
        auVar16._14_2_ = auVar18._6_2_;
        auVar15._12_4_ = auVar16._12_4_;
        auVar15._0_10_ = auVar18._0_10_;
        auVar15._10_2_ = auVar18._4_2_;
        auVar14._10_6_ = auVar15._10_6_;
        auVar14._0_8_ = auVar18._0_8_;
        auVar14._8_2_ = auVar18._4_2_;
        auVar7._4_8_ = auVar14._8_8_;
        auVar7._2_2_ = auVar18._2_2_;
        auVar7._0_2_ = auVar18._2_2_;
        iVar10 = (int)((float)(int)auVar18._10_2_ * scale + 0.5);
        iVar5 = (int)((float)(int)auVar18._12_2_ * scale + 0.5);
        iVar6 = (int)((float)(int)auVar18._14_2_ * scale + 0.5);
        auVar17._0_4_ = (int)((float)(int)auVar18._0_2_ * scale + 0.5);
        auVar17._4_4_ = (int)((float)(auVar7._0_4_ >> 0x10) * scale + 0.5);
        auVar17._8_4_ = (int)((float)(auVar14._8_4_ >> 0x10) * scale + 0.5);
        auVar17._12_4_ = (int)((float)(auVar15._12_4_ >> 0x10) * scale + 0.5);
        auVar3._4_2_ = (short)iVar10;
        auVar3._0_4_ = (int)((float)(int)auVar18._8_2_ * scale + 0.5);
        auVar3._6_2_ = (short)((uint)iVar10 >> 0x10);
        auVar3._8_2_ = (short)iVar5;
        auVar3._10_2_ = (short)((uint)iVar5 >> 0x10);
        auVar3._12_2_ = (short)iVar6;
        auVar3._14_2_ = (short)((uint)iVar6 >> 0x10);
        auVar18 = packssdw(auVar17,auVar3);
        *(undefined1 (*) [16])(local_208 + lVar11) = auVar18;
        auVar18 = *(undefined1 (*) [16])(ISACSavedEnc_obj->imagFFT + lVar11);
        auVar21._0_12_ = auVar18._0_12_;
        auVar21._12_2_ = auVar18._6_2_;
        auVar21._14_2_ = auVar18._6_2_;
        auVar20._12_4_ = auVar21._12_4_;
        auVar20._0_10_ = auVar18._0_10_;
        auVar20._10_2_ = auVar18._4_2_;
        auVar19._10_6_ = auVar20._10_6_;
        auVar19._0_8_ = auVar18._0_8_;
        auVar19._8_2_ = auVar18._4_2_;
        auVar8._4_8_ = auVar19._8_8_;
        auVar8._2_2_ = auVar18._2_2_;
        auVar8._0_2_ = auVar18._2_2_;
        iVar10 = (int)((float)(int)auVar18._10_2_ * scale + 0.5);
        iVar5 = (int)((float)(int)auVar18._12_2_ * scale + 0.5);
        iVar6 = (int)((float)(int)auVar18._14_2_ * scale + 0.5);
        auVar22._0_4_ = (int)((float)(int)auVar18._0_2_ * scale + 0.5);
        auVar22._4_4_ = (int)((float)(auVar8._0_4_ >> 0x10) * scale + 0.5);
        auVar22._8_4_ = (int)((float)(auVar19._8_4_ >> 0x10) * scale + 0.5);
        auVar22._12_4_ = (int)((float)(auVar20._12_4_ >> 0x10) * scale + 0.5);
        auVar4._4_2_ = (short)iVar10;
        auVar4._0_4_ = (int)((float)(int)auVar18._8_2_ * scale + 0.5);
        auVar4._6_2_ = (short)((uint)iVar10 >> 0x10);
        auVar4._8_2_ = (short)iVar5;
        auVar4._10_2_ = (short)((uint)iVar5 >> 0x10);
        auVar4._12_2_ = (short)iVar6;
        auVar4._14_2_ = (short)((uint)iVar6 >> 0x10);
        auVar18 = packssdw(auVar22,auVar4);
        *(undefined1 (*) [16])(local_3e8 + lVar11) = auVar18;
        lVar11 = lVar11 + 8;
      } while (lVar11 != 0xf0);
      fr = local_208;
      fi = local_3e8;
    }
    iVar10 = WebRtcIsac_EncodeSpec(fr,fi,0,bVar12 + kIsacUpperBand12,bitStream);
    if (-1 < iVar10) {
      iVar10 = WebRtcIsac_EncTerminate(bitStream);
    }
  }
  return iVar10;
}

Assistant:

int WebRtcIsac_EncodeStoredDataUb(
    const ISACUBSaveEncDataStruct* ISACSavedEnc_obj,
    Bitstr* bitStream,
    int32_t jitterInfo,
    float scale,
    enum ISACBandwidth bandwidth) {
  int n;
  int err;
  double lpcGain[SUBFRAMES];
  int16_t realFFT[FRAMESAMPLES_HALF];
  int16_t imagFFT[FRAMESAMPLES_HALF];
  const uint16_t** shape_cdf;
  int shape_len;
  const int16_t kAveragePitchGain = 0.0;
  enum ISACBand band;
  /* Reset bitstream. */
  WebRtcIsac_ResetBitstream(bitStream);

  /* Encode jitter index. */
  WebRtcIsac_EncodeJitterInfo(jitterInfo, bitStream);

  err = WebRtcIsac_EncodeBandwidth(bandwidth, bitStream);
  if (err < 0) {
    return err;
  }

  /* Encode LPC-shape. */
  if (bandwidth == isac12kHz) {
    shape_cdf = WebRtcIsac_kLpcShapeCdfMatUb12;
    shape_len = UB_LPC_ORDER * UB_LPC_VEC_PER_FRAME;
    band = kIsacUpperBand12;
  } else {
    shape_cdf = WebRtcIsac_kLpcShapeCdfMatUb16;
    shape_len = UB_LPC_ORDER * UB16_LPC_VEC_PER_FRAME;
    band = kIsacUpperBand16;
  }
  WebRtcIsac_EncHistMulti(bitStream, ISACSavedEnc_obj->indexLPCShape,
                          shape_cdf, shape_len);

  if ((scale <= 0.0) || (scale >= 1.0)) {
    /* We only consider scales between zero and one. */
    WebRtcIsac_EncHistMulti(bitStream, ISACSavedEnc_obj->lpcGainIndex,
                            WebRtcIsac_kLpcGainCdfMat, UB_LPC_GAIN_DIM);
    if (bandwidth == isac16kHz) {
      /* Store gain indices of the second half. */
      WebRtcIsac_EncHistMulti(bitStream,
                              &ISACSavedEnc_obj->lpcGainIndex[SUBFRAMES],
                              WebRtcIsac_kLpcGainCdfMat, UB_LPC_GAIN_DIM);
    }
    /* Store FFT coefficients. */
    err = WebRtcIsac_EncodeSpec(ISACSavedEnc_obj->realFFT,
                                ISACSavedEnc_obj->imagFFT, kAveragePitchGain,
                                band, bitStream);
  } else {
    /* Scale LPC gain and FFT coefficients. */
    for (n = 0; n < SUBFRAMES; n++) {
      lpcGain[n] = scale * ISACSavedEnc_obj->lpcGain[n];
    }
    /* Store LPC gains. */
    WebRtcIsac_StoreLpcGainUb(lpcGain, bitStream);

    if (bandwidth == isac16kHz) {
      /* Scale and code the gains of the second half of the frame, if 16kHz. */
      for (n = 0; n < SUBFRAMES; n++) {
        lpcGain[n] = scale * ISACSavedEnc_obj->lpcGain[n + SUBFRAMES];
      }
      WebRtcIsac_StoreLpcGainUb(lpcGain, bitStream);
    }

    for (n = 0; n < FRAMESAMPLES_HALF; n++) {
      realFFT[n] = (int16_t)(scale * (float)ISACSavedEnc_obj->realFFT[n] +
          0.5f);
      imagFFT[n] = (int16_t)(scale * (float)ISACSavedEnc_obj->imagFFT[n] +
          0.5f);
    }
    /* Store FFT coefficients. */
    err = WebRtcIsac_EncodeSpec(realFFT, imagFFT, kAveragePitchGain,
                                band, bitStream);
  }
  if (err < 0) {
    /* Error happened while encoding FFT coefficients. */
    return err;
  }

  /* Complete arithmetic coding. */
  return WebRtcIsac_EncTerminate(bitStream);
}